

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

size_t ilog2i(size_t i)

{
  size_t sVar1;
  size_t l;
  size_t i_local;
  
  if (i == 0) {
    i_local = 0;
  }
  else {
    sVar1 = ilog2(i);
    i_local = i * sVar1 + (i - (uint)(1 << ((byte)sVar1 & 0x1f))) * 2;
  }
  return i_local;
}

Assistant:

static size_t ilog2i(size_t i) {
  size_t l;
  if(i == 0) return 0;
  l = ilog2(i);
  /* approximate i*log2(i): l is integer logarithm, ((i - (1u << l)) << 1u)
  linearly approximates the missing fractional part multiplied by i */
  return i * l + ((i - (1u << l)) << 1u);
}